

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

char * Curl_mime_contenttype(char *filename)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  
  if (filename != (char *)0x0) {
    sVar2 = strlen(filename);
    for (lVar4 = 8; lVar4 != 0xa8; lVar4 = lVar4 + 0x10) {
      __s = *(char **)((long)&encoders[5].sizefunc + lVar4);
      sVar3 = strlen(__s);
      if ((sVar3 <= sVar2) &&
         (iVar1 = Curl_strcasecompare(filename + (sVar2 - sVar3),__s), iVar1 != 0)) {
        return *(char **)((long)&Curl_mime_contenttype::ctts[0].extension + lVar4);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *Curl_mime_contenttype(const char *filename)
{
  unsigned int i;

  /*
   * If no content type was specified, we scan through a few well-known
   * extensions and pick the first we match!
   */
  struct ContentType {
    const char *extension;
    const char *type;
  };
  static const struct ContentType ctts[] = {
    {".gif",  "image/gif"},
    {".jpg",  "image/jpeg"},
    {".jpeg", "image/jpeg"},
    {".png",  "image/png"},
    {".svg",  "image/svg+xml"},
    {".txt",  "text/plain"},
    {".htm",  "text/html"},
    {".html", "text/html"},
    {".pdf",  "application/pdf"},
    {".xml",  "application/xml"}
  };

  if(filename) {
    size_t len1 = strlen(filename);
    const char *nameend = filename + len1;

    for(i = 0; i < sizeof ctts / sizeof ctts[0]; i++) {
      size_t len2 = strlen(ctts[i].extension);

      if(len1 >= len2 && strcasecompare(nameend - len2, ctts[i].extension))
          return ctts[i].type;
    }
  }
  return NULL;
}